

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O2

void __thiscall
TSMuxer::buildPesHeader(TSMuxer *this,uint8_t pesStreamID,AVPacket *avPacket,int pid)

{
  long dts;
  undefined8 uVar1;
  undefined8 uVar2;
  pointer puVar3;
  undefined8 uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long *plVar8;
  uint num;
  pointer __dest;
  long pts;
  pointer ppVar9;
  undefined1 auVar10 [16];
  PriorityDataInfo tmpPriorityData;
  uint8_t tmpBuffer [2048];
  int local_85c;
  undefined1 local_858 [16];
  pointer local_848;
  PESPacket local_838 [227];
  undefined1 local_38 [8];
  
  lVar6 = avPacket->dts / 0xe5b0;
  dts = lVar6 + this->m_timeOffset;
  lVar7 = avPacket->pts / 0xe5b0;
  pts = this->m_timeOffset + lVar7;
  memset(local_838,0,0x800);
  if (lVar6 == lVar7) {
    PESPacket::serialize(local_838,pts,pesStreamID);
  }
  else {
    PESPacket::serialize(local_838,pts,dts,pesStreamID);
  }
  this->m_lastPESDTS = dts;
  uVar1 = avPacket->pts;
  uVar2 = avPacket->dts;
  auVar10._8_4_ = (int)uVar1;
  auVar10._0_8_ = uVar2;
  auVar10._12_4_ = (int)((ulong)uVar1 >> 0x20);
  this->m_fullPesDTS = uVar2;
  this->m_fullPesPTS = auVar10._8_8_;
  local_838[0].flagsHi = local_838[0].flagsHi | 4;
  if (avPacket->codec != (BaseAbstractStreamReader *)0x0) {
    plVar8 = (long *)__dynamic_cast(avPacket->codec,&BaseAbstractStreamReader::typeinfo,
                                    &AbstractStreamReader::typeinfo,0);
    if (plVar8 != (long *)0x0) {
      (**(code **)(*plVar8 + 0x50))(plVar8,local_838,avPacket);
    }
  }
  if ((avPacket->flags & 2) != 0) {
    PESPacket::setPacketLength
              (local_838,(uint)(byte)(local_838[0].m_pesHeaderLen + 9) + avPacket->size);
  }
  local_848 = (pointer)0x0;
  local_858 = (undefined1  [16])0x0;
  iVar5 = (*avPacket->codec->_vptr_BaseAbstractStreamReader[2])
                    (avPacket->codec,
                     &local_838[0].startCode0 + (byte)(local_838[0].m_pesHeaderLen + 9),local_38,
                     avPacket);
  num = iVar5 + (uint)(byte)(local_838[0].m_pesHeaderLen + 9);
  MemoryBlock::resize(&this->m_pesData,num);
  puVar3 = (this->m_pesData).m_data.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  __dest = (pointer)0x0;
  if (puVar3 != (this->m_pesData).m_data.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    __dest = puVar3;
  }
  memcpy(__dest,local_838,(long)(int)num);
  uVar4 = local_858._8_8_;
  for (ppVar9 = (pointer)local_858._0_8_; ppVar9 != (pointer)uVar4; ppVar9 = ppVar9 + 1) {
    local_85c = (uint)(byte)(local_838[0].m_pesHeaderLen + 9) + ppVar9->first;
    std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int,int&>
              ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
               &this->m_priorityData,&local_85c,&ppVar9->second);
  }
  std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
            ((_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_858);
  return;
}

Assistant:

void TSMuxer::buildPesHeader(const uint8_t pesStreamID, AVPacket& avPacket, int pid)
{
    const int64_t curDts = internalClockToPts(avPacket.dts) + m_timeOffset;
    const int64_t curPts = internalClockToPts(avPacket.pts) + m_timeOffset;
    uint8_t tmpBuffer[2048]{0};
    const auto pesPacket = reinterpret_cast<PESPacket*>(tmpBuffer);
    if (curDts != curPts)
        pesPacket->serialize(curPts, curDts, pesStreamID);
    else
        pesPacket->serialize(curPts, pesStreamID);
    m_lastPESDTS = curDts;
    m_fullPesDTS = avPacket.dts;
    m_fullPesPTS = avPacket.pts;
    pesPacket->flagsHi |= PES_DATA_ALIGNMENT;
    // int additionDataSize = avPacket.codec->writePESExtension(pesPacket);
    const auto ast = dynamic_cast<AbstractStreamReader*>(avPacket.codec);
    if (ast)
        ast->writePESExtension(pesPacket, avPacket);
    if (avPacket.flags & AVPacket::IS_COMPLETE_FRAME)
        pesPacket->setPacketLength(avPacket.size + pesPacket->getHeaderLength());

    PriorityDataInfo tmpPriorityData;
    const int additionDataSize = avPacket.codec->writeAdditionData(
        tmpBuffer + pesPacket->getHeaderLength(), tmpBuffer + sizeof(tmpBuffer), avPacket, &tmpPriorityData);
    const int bufLen = pesPacket->getHeaderLength() + additionDataSize;
    m_pesData.resize(bufLen);
    memcpy(m_pesData.data(), tmpBuffer, bufLen);
    for (auto& i : tmpPriorityData) m_priorityData.emplace_back(i.first + pesPacket->getHeaderLength(), i.second);
}